

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O3

void __thiscall
TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest::setup
          (TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest *this)

{
  MemoryLeakFailureForTest *pMVar1;
  MemoryLeakDetector *this_00;
  AllocatorForMemoryLeakDetectionTest *this_01;
  SimpleString *this_02;
  
  pMVar1 = (MemoryLeakFailureForTest *)
           operator_new(0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                        ,0x74);
  (pMVar1->super_MemoryLeakFailure)._vptr_MemoryLeakFailure =
       (_func_int **)&PTR__MemoryLeakFailure_00361360;
  this->reporter = pMVar1;
  this_00 = (MemoryLeakDetector *)
            operator_new(0x1298,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0x75);
  MemoryLeakDetector::MemoryLeakDetector(this_00,&this->reporter->super_MemoryLeakFailure);
  this->detector = this_00;
  this_01 = (AllocatorForMemoryLeakDetectionTest *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0x76);
  TestMemoryAllocator::TestMemoryAllocator((TestMemoryAllocator *)this_01,"generic","alloc","free");
  (this_01->super_TestMemoryAllocator)._vptr_TestMemoryAllocator =
       (_func_int **)&PTR__MemoryLeakAllocator_00361518;
  *(undefined8 *)&(this_01->super_TestMemoryAllocator).field_0x24 = 0;
  this_01->allocMemoryLeakNodeCalled = 0;
  this_01->freeMemoryLeakNodeCalled = 0;
  this->testAllocator = this_01;
  MemoryLeakDetector::enable(this->detector);
  MemoryLeakDetector::startChecking(this->detector);
  this_02 = (SimpleString *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0x79);
  SimpleString::SimpleString(this_02,"");
  this->reporter->message = this_02;
  return;
}

Assistant:

void setup() _override
    {
        reporter = new MemoryLeakFailureForTest;
        detector = new MemoryLeakDetector(reporter);
        testAllocator = new AllocatorForMemoryLeakDetectionTest;
        detector->enable();
        detector->startChecking();
        reporter->message = new SimpleString();
    }